

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_forcestep(lua_State *L)

{
  global_State *pgVar1;
  bool bVar2;
  int local_1c;
  int i;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if (pgVar1->gckind == '\x02') {
    generationalcollection(L);
  }
  else {
    incstep(L);
  }
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if ((pgVar1->tobefnz != (GCObject *)0x0) && (bVar2 = true, 3 < local_1c)) {
      bVar2 = pgVar1->gcstate == '\x05';
    }
    if (!bVar2) break;
    GCTM(L,1);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void luaC_forcestep (lua_State *L) {
  global_State *g = G(L);
  int i;
  if (isgenerational(g)) generationalcollection(L);
  else incstep(L);
  /* run a few finalizers (or all of them at the end of a collect cycle) */
  for (i = 0; g->tobefnz && (i < GCFINALIZENUM || g->gcstate == GCSpause); i++)
    GCTM(L, 1);  /* call one finalizer */
}